

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

int __thiscall libwebvtt::Parser::Init(Parser *this)

{
  int iVar1;
  int iVar2;
  int unaff_EBP;
  char cVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  string line;
  string local_50;
  
  iVar1 = ParseBOM(this);
  if (iVar1 < 0) {
    return iVar1;
  }
  if (iVar1 != 0) {
    return -1;
  }
  cVar3 = 'W';
  lVar4 = 1;
  bVar6 = false;
  do {
    iVar1 = (**(this->super_LineReader).super_Reader._vptr_Reader)(this,&local_50);
    if (iVar1 < 0) {
      bVar5 = false;
    }
    else if (iVar1 == 0) {
      bVar5 = (char)local_50._M_dataplus._M_p == cVar3;
      iVar1 = unaff_EBP;
      if (!bVar5) {
        iVar1 = -1;
      }
    }
    else {
      bVar5 = false;
      iVar1 = -1;
    }
    if (!bVar5) break;
    cVar3 = (&DAT_0011d300)[lVar4];
    bVar6 = cVar3 == '\0';
    lVar4 = lVar4 + 1;
    unaff_EBP = iVar1;
  } while (lVar4 != 7);
  if (!bVar6) {
    return iVar1;
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  iVar2 = LineReader::GetLine(&this->super_LineReader,&local_50);
  if ((-1 < iVar2) && (bVar6 = iVar2 == 0, iVar2 = 0, bVar6)) {
    if (local_50._M_string_length != 0) {
      cVar3 = *local_50._M_dataplus._M_p;
      if ((cVar3 == ' ') || (iVar2 = -1, cVar3 == '\t')) {
        iVar2 = iVar1;
      }
      if ((cVar3 != ' ') && (cVar3 != '\t')) goto LAB_0010de4a;
    }
    iVar2 = LineReader::GetLine(&this->super_LineReader,&local_50);
    bVar6 = iVar2 == 0;
    if ((-1 < iVar2) && (iVar2 = 0, bVar6)) {
      iVar2 = -(uint)(local_50._M_string_length != 0);
    }
  }
LAB_0010de4a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

int Parser::Init() {
  int e = ParseBOM();

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return -1;

  // Parse "WEBVTT".  We read from the stream one character at-a-time, in
  // order to defend against non-WebVTT streams (e.g. binary files) that don't
  // happen to comprise lines of text demarcated with line terminators.

  const char kId[] = "WEBVTT";

  for (const char* p = kId; *p; ++p) {
    char c;
    e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    if (c != *p)
      return -1;
  }

  std::string line;

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but valid

  if (!line.empty()) {
    // Parse optional characters that follow "WEBVTT"

    const char c = line[0];

    if (c != kSPACE && c != kTAB)
      return -1;
  }

  // The WebVTT spec requires that the "WEBVTT" line
  // be followed by an empty line (to separate it from
  // first cue).

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but we allow it

  if (!line.empty())
    return -1;

  return 0;  // success
}